

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

FString __thiscall FString::Mid(FString *this,size_t pos,size_t numChars)

{
  ulong uVar1;
  size_t len;
  ulong in_RCX;
  size_t sVar2;
  
  uVar1 = (ulong)*(uint *)(*(long *)pos + -0xc);
  sVar2 = uVar1 - numChars;
  if (uVar1 < numChars || sVar2 == 0) {
    this->Chars = (char *)0x71deec;
    NullString.RefCount = NullString.RefCount + 1;
  }
  else {
    len = in_RCX;
    if (uVar1 < in_RCX + numChars) {
      len = sVar2;
    }
    if (CARRY8(in_RCX,numChars)) {
      len = sVar2;
    }
    FString(this,(char *)(*(long *)pos + numChars),len);
  }
  return (FString)(char *)this;
}

Assistant:

FString FString::Mid (size_t pos, size_t numChars) const
{
	size_t len = Len();
	if (pos >= len)
	{
		return FString();
	}
	if (pos + numChars > len || pos + numChars < pos)
	{
		numChars = len - pos;
	}
	return FString (Chars + pos, numChars);
}